

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNStmReturn::gen_code(CTPNStmReturn *this,int param_1,int param_2)

{
  byte bVar1;
  CTPNCodeBody *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uchar uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *pCVar8;
  uint unaff_R14D;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar8 = (this->super_CTPNStmReturnBase).expr_;
  if (pCVar8 == (CTcPrsNode *)0x0) {
    bVar3 = true;
    bVar5 = false;
  }
  else {
    unaff_R14D = 0x33d830;
    if ((G_cg->field_0xd0 & 1) != 0) {
      CTPNStmBase::log_error((CTPNStmBase *)this,0x2e29);
      pCVar8 = (this->super_CTPNStmReturnBase).expr_;
    }
    iVar7 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if (CONCAT44(extraout_var,iVar7) != 0) {
      iVar7 = (*(((this->super_CTPNStmReturnBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      bVar5 = true;
      bVar3 = true;
      if (*(int *)CONCAT44(extraout_var_00,iVar7) - 1U < 2) goto LAB_00213c64;
    }
    iVar7 = G_cg->sp_depth_;
    pCVar8 = (this->super_CTPNStmReturnBase).expr_;
    bVar5 = false;
    (**(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar8,0,0);
    bVar3 = G_cg->sp_depth_ <= iVar7;
  }
LAB_00213c64:
  if (G_cs->enclosing_ != (CTPNStmEnclosing *)0x0) {
    bVar4 = true;
    if (((!bVar3) &&
        (iVar7 = (*(G_cs->enclosing_->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.
                   super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x22])(), iVar7 != 0)) &&
       (pCVar2 = G_cs->code_body_, pCVar2 != (CTPNCodeBody *)0x0)) {
      bVar1 = pCVar2->field_0xd4;
      if ((bVar1 & 2) == 0) {
        unaff_R14D = (pCVar2->super_CTPNCodeBodyBase).local_cnt_;
        (pCVar2->super_CTPNCodeBodyBase).local_cnt_ = unaff_R14D + 1;
        pCVar2->fin_ret_lcl_ = unaff_R14D;
        pCVar2->field_0xd4 = bVar1 | 2;
      }
      else {
        unaff_R14D = pCVar2->fin_ret_lcl_;
      }
      bVar4 = false;
      CTcSymLocal::s_gen_code_setlcl_stk(unaff_R14D,0);
    }
    (*(G_cs->enclosing_->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0x21])();
    if (!bVar4) {
      CTcSymLocal::s_gen_code_getlcl(unaff_R14D,0);
    }
  }
  if ((G_cg->field_0xd0 & 1) != 0) {
    CTcGenTarg::write_op(G_cg,0x84);
    uVar6 = 'P';
    goto LAB_00213d6b;
  }
  pCVar8 = (this->super_CTPNStmReturnBase).expr_;
  if (pCVar8 != (CTcPrsNode *)0x0) {
    iVar7 = (*(pCVar8->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(pCVar8);
    if (CONCAT44(extraout_var_01,iVar7) != 0) {
      iVar7 = (*(((this->super_CTPNStmReturnBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      if (*(int *)CONCAT44(extraout_var_02,iVar7) == 1) {
        uVar6 = 'Q';
      }
      else {
        if (*(int *)CONCAT44(extraout_var_02,iVar7) != 2) goto LAB_00213d59;
        uVar6 = 'R';
      }
      CTcGenTarg::write_op(G_cg,uVar6);
    }
LAB_00213d59:
    if (bVar5) {
      return;
    }
    if (!bVar3) {
      CTcGenTarg::write_op(G_cg,'P');
      G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
      return;
    }
  }
  uVar6 = 'Q';
LAB_00213d6b:
  CTcGenTarg::write_op(G_cg,uVar6);
  return;
}

Assistant:

void CTPNStmReturn::gen_code(int, int)
{
    int val_on_stack;
    int need_gen;

    /* add a line record */
    add_debug_line_rec();

    /* presume we'll generate a value */
    need_gen = TRUE;
    val_on_stack = FALSE;

    /* generate the return value expression, if appropriate */
    if (expr_ != 0)
    {
        /* 
         *   it's an error if we're in a constructor, because a
         *   constructor implicitly always returns 'self' 
         */
        if (G_cg->is_in_constructor())
            log_error(TCERR_CONSTRUCT_CANNOT_RET_VAL);

        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
            case TC_CVT_TRUE:
                /* 
                 *   we can use special constant return instructions for
                 *   these, so there's no need to generate the value 
                 */
                need_gen = FALSE;
                break;

            default:
                /* 
                 *   other types don't have constant-return opcodes, so we
                 *   must generate the expression code 
                 */
                need_gen = TRUE;
                break;
            }
        }

        /* if necessary, generate the value */
        if (need_gen)
        {
            int depth;

            /* note the initial stack depth */
            depth = G_cg->get_sp_depth();

            /*  
             *   Generate the value.  We are obviously not discarding the
             *   value, and since returning a value is equivalent to
             *   assigning the value, we must use the stricter assignment
             *   (not 'for condition') rules for logical expressions 
             */
            expr_->gen_code(FALSE, FALSE);

            /* note whether we actually left a value on the stack */
            val_on_stack = (G_cg->get_sp_depth() > depth);
        }
        else
        {
            /* 
             *   we obviously aren't leaving a value on the stack if we
             *   don't generate anything 
             */
            val_on_stack = FALSE;
        }
    }

    /* 
     *   Before we return, let any enclosing statements generate any code
     *   necessary to leave their scope (in particular, we must invoke
     *   'finally' handlers in any enclosing 'try' blocks).
     *   
     *   Note that we generated the expression BEFORE we call any
     *   'finally' handlers.  This is necessary because something we call
     *   in the course of evaluating the return value could have thrown an
     *   exception; if we were to call the 'finally' clauses before
     *   generating the return value, we could invoke the 'finally' clause
     *   twice (once explicitly, once in the handling of the thrown
     *   exception), which would be incorrect.  By generating the
     *   'finally' calls after the return expression, we're sure that the
     *   'finally' blocks are invoked only once - either through the
     *   throw, or else now, after there's no more possibility of a
     *   'throw' before the return.  
     */
    if (G_cs->get_enclosing() != 0)
    {
        int did_save_retval;
        uint fin_ret_lcl;

        /* 
         *   if we're going to generate any subroutine calls, and we have
         *   a return value on the stack, we need to save the return value
         *   in a local to make sure the calculated value isn't affected
         *   by the subroutine call 
         */
        if (val_on_stack
            && G_cs->get_enclosing()->will_gen_code_unwind_for_return()
            && G_cs->get_code_body() != 0)
        {
            /* allocate a local variable to save the return value */
            fin_ret_lcl = G_cs->get_code_body()->alloc_fin_ret_lcl();

            /* save the return value in a stack temporary for a moment */
            CTcSymLocal::s_gen_code_setlcl_stk(fin_ret_lcl, FALSE);

            /* 
             *   note that we saved the return value, so we can retrieve
             *   it later 
             */
            did_save_retval = TRUE;
        }
        else
        {
            /* note that we didn't save the return value */
            did_save_retval = FALSE;
        }

        /* generate the unwind */
        G_cs->get_enclosing()->gen_code_unwind_for_return();

        /* if we saved the return value, retrieve it */
        if (did_save_retval)
            CTcSymLocal::s_gen_code_getlcl(fin_ret_lcl, FALSE);
    }

    /* check for an expression to return */
    if (G_cg->is_in_constructor())
    {
        /* we're in a constructor - return 'self' */
        G_cg->write_op(OPC_PUSHSELF);
        G_cg->write_op(OPC_RETVAL);
    }
    else if (expr_ == 0)
    {
        /* 
         *   there's no expression - generate a simple void return (but
         *   explicitly return nil, so we don't return something left in
         *   R0 from a previous function call we made) 
         */
        G_cg->write_op(OPC_RETNIL);
    }
    else
    {
        /* check for a constant expression */
        if (expr_->is_const())
        {
            switch(expr_->get_const_val()->get_type())
            {
            case TC_CVT_NIL:
                /* generate a RETNIL instruction */
                G_cg->write_op(OPC_RETNIL);
                break;

            case TC_CVT_TRUE:
                /* generate a RETTRUE instruction */
                G_cg->write_op(OPC_RETTRUE);
                break;

            default:
                break;
            }
        }

        /* 
         *   if we needed code generation to evaluate the return value, we
         *   now need to return the value 
         */
        if (need_gen)
        {
            /* 
             *   Other types don't have constant-return opcodes.  We
             *   already generated the expression value (before invoking
             *   the enclosing 'finally' handlers, if any), so the value
             *   is on the stack, and all we need to do is return it.
             *   
             *   If we didn't actually leave a value on the stack, we'll
             *   just return nil.  
             */
            if (val_on_stack)
            {
                /* generate the return-value opcode */
                G_cg->write_op(OPC_RETVAL);
                
                /* RETVAL removes an element from the stack */
                G_cg->note_pop();
            }
            else
            {
                /* 
                 *   The depth didn't change - they must have evaluated an
                 *   expression involving a dstring or void function.
                 *   Return nil instead of the non-existent value.  
                 */
                G_cg->write_op(OPC_RETNIL);
            }
        }
    }
}